

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

PropertyRecord * __thiscall
ThreadContext::FindPropertyRecord(ThreadContext *this,char16 *propertyName,int propertyNameLength)

{
  BaseHashSet<Js::PropertyRecord_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecord_const*,Js::PropertyRecordStringHashComparer,JsUtil::SimpleHashedEntry,JsUtil::AsymetricResizeLock>
  *pBVar1;
  code *pcVar2;
  bool bVar3;
  PropertyRecord *pPVar4;
  undefined4 *puVar5;
  PropertyRecord **ppPVar6;
  HashedCharacterBuffer<char16_t> local_50;
  HashedCharacterBuffer<char16_t> local_40;
  PropertyRecord *local_30;
  PropertyRecord *propertyRecord;
  char16 *pcStack_20;
  int propertyNameLength_local;
  char16 *propertyName_local;
  ThreadContext *this_local;
  
  propertyRecord._4_4_ = propertyNameLength;
  pcStack_20 = propertyName;
  propertyName_local = (char16 *)this;
  if (propertyNameLength < 2) {
    if (propertyNameLength == 0) {
      pPVar4 = GetEmptyStringPropertyRecord(this);
      return pPVar4;
    }
    bVar3 = IsDirectPropertyName(this,propertyName,propertyNameLength);
    if (bVar3) {
      pPVar4 = this->propertyNamesDirect[(ushort)*pcStack_20];
      pBVar1 = (BaseHashSet<Js::PropertyRecord_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecord_const*,Js::PropertyRecordStringHashComparer,JsUtil::SimpleHashedEntry,JsUtil::AsymetricResizeLock>
                *)this->propertyMap;
      local_30 = pPVar4;
      Js::HashedCharacterBuffer<char16_t>::HashedCharacterBuffer
                (&local_40,pcStack_20,propertyRecord._4_4_);
      ppPVar6 = JsUtil::
                BaseHashSet<Js::PropertyRecord_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecord_const*,Js::PropertyRecordStringHashComparer,JsUtil::SimpleHashedEntry,JsUtil::AsymetricResizeLock>
                ::LookupWithKey<Js::HashedCharacterBuffer<char16_t>>(pBVar1,&local_40);
      if (pPVar4 != *ppPVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                           ,0x381,
                           "(propertyRecord == propertyMap->LookupWithKey(Js::HashedCharacterBuffer<char16>(propertyName, propertyNameLength)))"
                           ,
                           "propertyRecord == propertyMap->LookupWithKey(Js::HashedCharacterBuffer<char16>(propertyName, propertyNameLength))"
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      return local_30;
    }
  }
  pBVar1 = (BaseHashSet<Js::PropertyRecord_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecord_const*,Js::PropertyRecordStringHashComparer,JsUtil::SimpleHashedEntry,JsUtil::AsymetricResizeLock>
            *)this->propertyMap;
  Js::HashedCharacterBuffer<char16_t>::HashedCharacterBuffer
            (&local_50,pcStack_20,propertyRecord._4_4_);
  ppPVar6 = JsUtil::
            BaseHashSet<Js::PropertyRecord_const*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecord_const*,Js::PropertyRecordStringHashComparer,JsUtil::SimpleHashedEntry,JsUtil::AsymetricResizeLock>
            ::LookupWithKey<Js::HashedCharacterBuffer<char16_t>>(pBVar1,&local_50);
  return *ppPVar6;
}

Assistant:

const Js::PropertyRecord *
ThreadContext::FindPropertyRecord(const char16 * propertyName, int propertyNameLength)
{
    // IsDirectPropertyName == 1 char properties && GetEmptyStringPropertyRecord == 0 length
    if (propertyNameLength < 2)
    {
        if (propertyNameLength == 0)
        {
            return this->GetEmptyStringPropertyRecord();
        }

    if (IsDirectPropertyName(propertyName, propertyNameLength))
    {
            Js::PropertyRecord const * propertyRecord = propertyNamesDirect[propertyName[0]];
        Assert(propertyRecord == propertyMap->LookupWithKey(Js::HashedCharacterBuffer<char16>(propertyName, propertyNameLength)));
            return propertyRecord;
    }
    }

    return propertyMap->LookupWithKey(Js::HashedCharacterBuffer<char16>(propertyName, propertyNameLength));
}